

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::_observer_epilogue(Executor *this,Worker *worker,Node *node)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->_observers)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    (*(code *)(p_Var1[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var1[1]._M_nxt,worker,node);
  }
  return;
}

Assistant:

inline void Executor::_observer_epilogue(Worker& worker, Node* node) {
  for(auto& observer : _observers) {
    observer->on_exit(WorkerView(worker), TaskView(*node));
  }
}